

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAxyzDD::NodeIntStateScatterAcceleration
          (ChNodeFEAxyzDD *this,uint off_a,ChStateDelta *a)

{
  double *local_a0;
  undefined8 local_98;
  ChStateDelta *local_88;
  ulong local_80;
  long local_70;
  ChVector<double> local_68;
  ChVector<double> local_50;
  ChVector<double> local_38;
  
  local_80 = (ulong)off_a;
  local_a0 = (a->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             local_80;
  local_70 = (a->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_98 = 3;
  if ((long)local_80 <= local_70 + -3) {
    local_88 = a;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_38,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_a0,(type *)0x0);
    if ((ChVector<double> *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x50 != &local_38)
    {
      *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x50 = local_38.m_data[0];
      *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x58 = local_38.m_data[1];
      *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x60 = local_38.m_data[2];
    }
    local_80 = (ulong)(off_a + 3);
    local_a0 = (a->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               local_80;
    local_70 = (a->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_98 = 3;
    if ((long)local_80 <= local_70 + -3) {
      local_88 = a;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_50,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_a0,(type *)0x0);
      if (&(this->super_ChNodeFEAxyzD).D_dtdt != &local_50) {
        (this->super_ChNodeFEAxyzD).D_dtdt.m_data[0] = local_50.m_data[0];
        (this->super_ChNodeFEAxyzD).D_dtdt.m_data[1] = local_50.m_data[1];
        (this->super_ChNodeFEAxyzD).D_dtdt.m_data[2] = local_50.m_data[2];
      }
      local_80 = (ulong)(off_a + 6);
      local_a0 = (a->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 local_80;
      local_70 = (a->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_98 = 3;
      if ((long)local_80 <= local_70 + -3) {
        local_88 = a;
        ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&local_68,
                   (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                    *)&local_a0,(type *)0x0);
        if (&this->DD_dtdt != &local_68) {
          (this->DD_dtdt).m_data[0] = local_68.m_data[0];
          (this->DD_dtdt).m_data[1] = local_68.m_data[1];
          (this->DD_dtdt).m_data[2] = local_68.m_data[2];
        }
        return;
      }
    }
  }
  local_98 = 3;
  local_88 = a;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzDD::NodeIntStateScatterAcceleration(const unsigned int off_a, const ChStateDelta& a) {
    SetPos_dtdt(a.segment(off_a, 3));
    SetD_dtdt(a.segment(off_a + 3, 3));
    SetDD_dtdt(a.segment(off_a + 6, 3));
}